

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-immediate.c
# Opt level: O1

void sv_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *rcvbuf,sockaddr *addr,uint flags)

{
  int iVar1;
  
  if (nread < 1) {
    sv_recv_cb_cold_1();
LAB_00189300:
    sv_recv_cb_cold_2();
  }
  else {
    if (nread != 4) goto LAB_00189300;
    if (addr != (sockaddr *)0x0) {
      if (*(int *)rcvbuf->base == 0x54495845) {
        uv_close((uv_handle_t *)handle,close_cb);
        uv_close((uv_handle_t *)&client,close_cb);
        sv_recv_cb_called = sv_recv_cb_called + 1;
        return;
      }
      goto LAB_0018930a;
    }
  }
  sv_recv_cb_cold_4();
LAB_0018930a:
  sv_recv_cb_cold_3();
  if (handle == &client || handle == &server) {
    iVar1 = uv_is_closing((uv_handle_t *)handle);
    if (iVar1 != 0) {
      close_cb_called = close_cb_called + 1;
      return;
    }
  }
  else {
    close_cb_cold_1();
  }
  close_cb_cold_2();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void sv_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* rcvbuf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  if (nread < 0) {
    ASSERT(0 && "unexpected error");
  }

  if (nread == 0) {
    /* Returning unused buffer. Don't count towards sv_recv_cb_called */
    ASSERT_NULL(addr);
    return;
  }

  CHECK_HANDLE(handle);
  ASSERT(flags == 0);

  ASSERT_NOT_NULL(addr);
  ASSERT(nread == 4);
  ASSERT(memcmp("PING", rcvbuf->base, nread) == 0 ||
         memcmp("PANG", rcvbuf->base, nread) == 0);

  if (++sv_recv_cb_called == 2) {
    uv_close((uv_handle_t*) &server, close_cb);
    uv_close((uv_handle_t*) &client, close_cb);
  }
}